

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O3

void MapOptHandler_outsidefogdensity(FMapInfoParser *parse,level_info_t *info)

{
  FGLROptions *pFVar1;
  FName local_14;
  
  FName::NameManager::FindName(&FName::NameData,"gl_renderer",false);
  pFVar1 = level_info_t::GetOptData<FGLROptions>(info,&local_14,true);
  FMapInfoParser::ParseAssign(parse);
  FScanner::MustGetNumber(&parse->sc);
  pFVar1->outsidefogdensity = (parse->sc).Number;
  return;
}

Assistant:

DEFINE_MAP_OPTION(outsidefogdensity, false)
{
	FGLROptions *opt = info->GetOptData<FGLROptions>("gl_renderer");
	parse.ParseAssign();
	parse.sc.MustGetNumber();
	opt->outsidefogdensity = parse.sc.Number;
}